

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode Curl_cf_https_setup(Curl_easy *data,connectdata *conn,int sockindex,
                            Curl_dns_entry *remotehost)

{
  byte bVar1;
  CURLcode CVar2;
  void *ctx;
  Curl_cfilter *cf;
  bool bVar3;
  Curl_cfilter *local_38;
  
  CVar2 = CURLE_OK;
  if (((conn->bits).field_0x3 & 2) != 0) {
    bVar1 = (data->state).httpwant;
    if (bVar1 == 0x1f) {
      CVar2 = Curl_conn_may_http3(data,conn);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      bVar3 = true;
    }
    else if (bVar1 < 0x1e) {
      bVar3 = false;
    }
    else {
      CVar2 = Curl_conn_may_http3(data,conn);
      bVar3 = CVar2 == CURLE_OK;
    }
    local_38 = (Curl_cfilter *)0x0;
    ctx = (*Curl_ccalloc)(1,0x90);
    if (ctx == (void *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
      ctx = (void *)0x0;
      cf = (Curl_cfilter *)0x0;
    }
    else {
      *(Curl_dns_entry **)((long)ctx + 8) = remotehost;
      *(bool *)((long)ctx + 0x54) = bVar3;
      *(bool *)((long)ctx + 0x84) = bVar1 != 0x1f;
      CVar2 = Curl_cf_create(&local_38,&Curl_cft_http_connect,ctx);
      cf = (Curl_cfilter *)0x0;
      if (CVar2 == CURLE_OK) {
        cf_hc_reset(local_38,data);
        CVar2 = CURLE_OK;
        ctx = (void *)0x0;
        cf = local_38;
      }
    }
    (*Curl_cfree)(ctx);
    if (CVar2 == CURLE_OK) {
      Curl_conn_cf_add(data,conn,sockindex,cf);
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_cf_https_setup(struct Curl_easy *data,
                             struct connectdata *conn,
                             int sockindex,
                             const struct Curl_dns_entry *remotehost)
{
  bool try_h3 = FALSE, try_h21 = TRUE; /* defaults, for now */
  CURLcode result = CURLE_OK;

  (void)sockindex;
  (void)remotehost;

  if(!conn->bits.tls_enable_alpn)
    goto out;

  if(data->state.httpwant == CURL_HTTP_VERSION_3ONLY) {
    result = Curl_conn_may_http3(data, conn);
    if(result) /* can't do it */
      goto out;
    try_h3 = TRUE;
    try_h21 = FALSE;
  }
  else if(data->state.httpwant >= CURL_HTTP_VERSION_3) {
    /* We assume that silently not even trying H3 is ok here */
    /* TODO: should we fail instead? */
    try_h3 = (Curl_conn_may_http3(data, conn) == CURLE_OK);
    try_h21 = TRUE;
  }

  result = cf_http_connect_add(data, conn, sockindex, remotehost,
                               try_h3, try_h21);
out:
  return result;
}